

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midithread.c
# Opt level: O1

void process_midi(PtTimestamp timestamp,void *userData)

{
  PmError PVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int32_t msg;
  PmEvent buffer;
  int local_28;
  uint local_24;
  PmEvent local_20;
  
  if (active != 0) {
    PVar1 = Pm_Dequeue(main_to_midi,&local_28);
    while (PVar1 != pmNoData) {
      iVar2 = local_28;
      if (0xfe < local_28 + 0x7fU) {
        iVar2 = transpose;
        if (local_28 == 0x3e9) {
          monitor = 1;
        }
        else if (local_28 == 0x3ea) {
          midi_thru = (int)(midi_thru == 0);
        }
        else if (local_28 == 1000) {
          Pm_Enqueue(midi_to_main,&local_28);
          active = 0;
          return;
        }
      }
      transpose = iVar2;
      PVar1 = Pm_Dequeue(main_to_midi,&local_28);
    }
    PVar1 = Pm_Poll(midi_in);
    if (PVar1 != pmNoData) {
      do {
        iVar2 = Pm_Read(midi_in,&local_20,1);
        if (iVar2 != -0x270c) {
          if (midi_thru != 0) {
            Pm_Write(midi_out,&local_20,1);
          }
          uVar3 = (uint)local_20.message >> 8 & 0xff;
          local_24 = uVar3;
          if ((local_20.message & 0xe0U | 0x10) == 0x90) {
            iVar2 = transpose + uVar3;
            iVar4 = 0x7f;
            if (iVar2 < 0x7f) {
              iVar4 = iVar2;
            }
            uVar5 = ((iVar2 - iVar4) + 0xbU) / 0xc;
            local_24 = iVar2 + uVar5 * -0xc;
            if ((int)local_24 < 0) {
              uVar6 = 0xfffffff4;
              if (-0xc < (int)local_24) {
                uVar6 = local_24;
              }
              local_24 = transpose +
                         ((uVar6 - (local_24 + ((int)local_24 < -0xc))) / 0xc +
                         (uint)((int)local_24 < -0xc)) * 0xc + uVar3 + uVar5 * -0xc + 0xc;
            }
            local_20.message = local_20.message & 0xff00ffU | (local_24 & 0xff) << 8;
            Pm_Write(midi_out,&local_20,1);
            if (monitor != 0) {
              Pm_Enqueue(midi_to_main,&local_24);
              monitor = 0;
            }
          }
        }
        PVar1 = Pm_Poll(midi_in);
      } while (PVar1 != pmNoData);
    }
  }
  return;
}

Assistant:

void process_midi(PtTimestamp timestamp, void *userData)
{
    PmError result;
    PmEvent buffer; /* just one message at a time */
    int32_t msg;

    /* do nothing until initialization completes */
    if (!active) 
        return;

    /* check for messages */
    do { 
        result = Pm_Dequeue(main_to_midi, &msg); 
        if (result) {
            if (msg >= -127 && msg <= 127) 
                transpose = msg;
            else if (msg == QUIT_MSG) {
                /* acknowledge receipt of quit message */
                Pm_Enqueue(midi_to_main, &msg);
                active = FALSE;
                return;
            } else if (msg == MONITOR_MSG) {
                /* main has requested a pitch. monitor is a flag that
                 * records the request:
                 */
                monitor = TRUE;
            } else if (msg == THRU_MSG) {
                /* toggle Thru on or off */
                midi_thru = !midi_thru;
            }
        }
    } while (result);         
    
    /* see if there is any midi input to process */
    do {
		result = Pm_Poll(midi_in);
        if (result) {
            int status, data1, data2;
            if (Pm_Read(midi_in, &buffer, 1) == pmBufferOverflow) 
                continue;
            if (midi_thru) 
                Pm_Write(midi_out, &buffer, 1);
            /* unless there was overflow, we should have a message now */
            status = Pm_MessageStatus(buffer.message);
            data1 = Pm_MessageData1(buffer.message);
            data2 = Pm_MessageData2(buffer.message);
            if ((status & 0xF0) == 0x90 ||
                (status & 0xF0) == 0x80) {
                
                /* this is a note-on or note-off, so transpose and send */
                data1 += transpose;
                
                /* keep within midi pitch range, keep proper pitch class */
                while (data1 > 127) 
                    data1 -= 12;
                while (data1 < 0) 
                    data1 += 12;
                
                /* send the message */
                buffer.message = Pm_Message(status, data1, data2);
                Pm_Write(midi_out, &buffer, 1);
                
                /* if monitor is set, send the pitch to the main thread */
                if (monitor) {
                    Pm_Enqueue(midi_to_main, &data1);
                    monitor = FALSE; /* only send one pitch per request */
                }
            }
        }
    } while (result);
}